

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_ext_gstate.c
# Opt level: O0

HPDF_Dict HPDF_ExtGState_New(HPDF_MMgr mmgr,HPDF_Xref xref)

{
  HPDF_STATUS HVar1;
  HPDF_Dict obj;
  HPDF_Xref xref_local;
  HPDF_MMgr mmgr_local;
  
  mmgr_local = (HPDF_MMgr)HPDF_Dict_New(mmgr);
  if ((HPDF_Dict)mmgr_local == (HPDF_Dict)0x0) {
    mmgr_local = (HPDF_MMgr)0x0;
  }
  else {
    HVar1 = HPDF_Xref_Add(xref,mmgr_local);
    if (HVar1 == 0) {
      HVar1 = HPDF_Dict_AddName((HPDF_Dict)mmgr_local,"Type","ExtGState");
      if (HVar1 == 0) {
        (((HPDF_Dict)mmgr_local)->header).obj_class =
             (((HPDF_Dict)mmgr_local)->header).obj_class | 0xa00;
      }
      else {
        mmgr_local = (HPDF_MMgr)0x0;
      }
    }
    else {
      mmgr_local = (HPDF_MMgr)0x0;
    }
  }
  return (HPDF_Dict)mmgr_local;
}

Assistant:

HPDF_Dict
HPDF_ExtGState_New  (HPDF_MMgr   mmgr, 
                     HPDF_Xref   xref)
{
    HPDF_Dict obj = HPDF_Dict_New (mmgr);

    HPDF_PTRACE ((" HPDF_ExtGState_New\n"));

    if (!obj)
        return NULL;

    if (HPDF_Xref_Add (xref, obj) != HPDF_OK)
        return NULL;

    if (HPDF_Dict_AddName (obj, "Type", "ExtGState") != HPDF_OK)
        return NULL;

    obj->header.obj_class |= HPDF_OSUBCLASS_EXT_GSTATE;

    return obj;
}